

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::~IfcRamp(IfcRamp *this)

{
  ~IfcRamp((IfcRamp *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}